

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_for_check(jit_State *J,IRType t,int dir,TRef stop,TRef step,int init)

{
  int iVar1;
  short sVar2;
  ushort uVar3;
  TRef TVar4;
  ushort in_CX;
  int in_EDX;
  int in_ESI;
  jit_State *in_RDI;
  ushort in_R8W;
  int in_R9D;
  int32_t k_1;
  TRef tr;
  int32_t k;
  TRef zero;
  uint64_t in_stack_ffffffffffffff38;
  jit_State *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  undefined2 in_stack_ffffffffffffff4e;
  jit_State *in_stack_ffffffffffffff50;
  IRRef1 local_90;
  
  if (in_R8W < 0x8000) {
    if (((in_R9D != 0) && (in_ESI == 0x13)) && (0x7fff < in_CX)) {
      sVar2 = 1;
      if (in_EDX != 0) {
        sVar2 = 2;
      }
      uVar3 = sVar2 << 8 | 0x93;
      TVar4 = lj_ir_kint(in_stack_ffffffffffffff50,CONCAT22(in_CX,sVar2 << 8) | 0x93);
      (in_RDI->fold).ins.field_0.ot = uVar3;
      (in_RDI->fold).ins.field_0.op1 = in_CX;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold((jit_State *)CONCAT26(in_CX,CONCAT24(uVar3,in_stack_ffffffffffffff48)));
    }
  }
  else {
    if (in_ESI == 0x13) {
      TVar4 = lj_ir_kint(in_stack_ffffffffffffff50,
                         CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c));
      local_90 = (IRRef1)TVar4;
    }
    else {
      TVar4 = lj_ir_knum_u64(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_90 = (IRRef1)TVar4;
    }
    (in_RDI->fold).ins.field_0.ot = (ushort)(in_EDX != 0) << 8 | (ushort)in_ESI | 0x80;
    (in_RDI->fold).ins.field_0.op1 = in_R8W;
    (in_RDI->fold).ins.field_0.op2 = local_90;
    lj_opt_fold((jit_State *)
                CONCAT26(in_stack_ffffffffffffff4e,
                         CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
    if ((in_R9D != 0) && (in_ESI == 0x13)) {
      if (in_CX < 0x8000) {
        iVar1 = (in_RDI->cur).ir[in_CX].i;
        if (in_EDX == 0) {
          if (iVar1 < 0) {
            TVar4 = lj_ir_kint(in_RDI,CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c))
            ;
            (in_RDI->fold).ins.field_0.ot = 0x193;
            (in_RDI->fold).ins.field_0.op1 = in_R8W;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
            lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_ffffffffffffff4e,
                                 CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
          }
        }
        else if (0 < iVar1) {
          TVar4 = lj_ir_kint(in_stack_ffffffffffffff50,
                             CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c));
          (in_RDI->fold).ins.field_0.ot = 0x293;
          (in_RDI->fold).ins.field_0.op1 = in_R8W;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_ffffffffffffff4e,
                               CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
        }
      }
      else {
        (in_RDI->fold).ins.field_0.ot = 0x3593;
        (in_RDI->fold).ins.field_0.op1 = in_R8W;
        (in_RDI->fold).ins.field_0.op2 = in_CX;
        TVar4 = lj_opt_fold((jit_State *)
                            CONCAT26(in_stack_ffffffffffffff4e,
                                     CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)))
        ;
        (in_RDI->fold).ins.field_0.ot = 0x1213;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (in_RDI->fold).ins.field_0.op2 = 0;
        lj_opt_fold((jit_State *)
                    CONCAT26(in_stack_ffffffffffffff4e,
                             CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
      }
    }
  }
  return;
}

Assistant:

static void rec_for_check(jit_State *J, IRType t, int dir,
			  TRef stop, TRef step, int init)
{
  if (!tref_isk(step)) {
    /* Non-constant step: need a guard for the direction. */
    TRef zero = (t == IRT_INT) ? lj_ir_kint(J, 0) : lj_ir_knum_zero(J);
    emitir(IRTG(dir ? IR_GE : IR_LT, t), step, zero);
    /* Add hoistable overflow checks for a narrowed FORL index. */
    if (init && t == IRT_INT) {
      if (tref_isk(stop)) {
	/* Constant stop: optimize check away or to a range check for step. */
	int32_t k = IR(tref_ref(stop))->i;
	if (dir) {
	  if (k > 0)
	    emitir(IRTGI(IR_LE), step, lj_ir_kint(J, (int32_t)0x7fffffff-k));
	} else {
	  if (k < 0)
	    emitir(IRTGI(IR_GE), step, lj_ir_kint(J, (int32_t)0x80000000-k));
	}
      } else {
	/* Stop+step variable: need full overflow check. */
	TRef tr = emitir(IRTGI(IR_ADDOV), step, stop);
	emitir(IRTI(IR_USE), tr, 0);  /* ADDOV is weak. Avoid dead result. */
      }
    }
  } else if (init && t == IRT_INT && !tref_isk(stop)) {
    /* Constant step: optimize overflow check to a range check for stop. */
    int32_t k = IR(tref_ref(step))->i;
    k = (int32_t)(dir ? 0x7fffffff : 0x80000000) - k;
    emitir(IRTGI(dir ? IR_LE : IR_GE), stop, lj_ir_kint(J, k));
  }
}